

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::repolish(QStyleSheetStyle *this,QWidget *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QWidget *local_50;
  QArrayDataPointer<const_QObject_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QObject **)0x0;
  QList<const_QObject_*>::reserve
            ((QList<const_QObject_*> *)&local_48,*(long *)(*(long *)&w->field_0x8 + 0x28) + 1);
  lVar1 = *(long *)(*(long *)&w->field_0x8 + 0x20);
  lVar2 = *(long *)(*(long *)&w->field_0x8 + 0x28);
  for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    QList<const_QObject_*>::append
              ((QList<const_QObject_*> *)&local_48,*(parameter_type *)(lVar1 + lVar3));
  }
  QList<const_QObject_*>::append((QList<const_QObject_*> *)&local_48,&w->super_QObject);
  local_50 = w;
  QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
            ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&local_50);
  updateObjects((QList<const_QObject_*> *)&local_48);
  QArrayDataPointer<const_QObject_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::repolish(QWidget *w)
{
    QList<const QObject *> children;
    children.reserve(w->children().size() + 1);
    for (auto child: std::as_const(w->children()))
        children.append(child);
    children.append(w);
    styleSheetCaches->styleSheetCache.remove(w);
    updateObjects(children);
}